

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void fits_free_region(SAORegion *Rgn)

{
  double *__ptr;
  double *pdVar1;
  void *__ptr_00;
  RgnShape *pRVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  __ptr_00 = malloc(0x50);
  if (0 < Rgn->nShapes) {
    lVar5 = 0;
    uVar4 = 10;
    uVar6 = 0;
    do {
      if (Rgn->Shapes[lVar5].shape == poly_rgn) {
        pRVar2 = Rgn->Shapes + lVar5;
        __ptr = (pRVar2->param).poly.Pts;
        if (pRVar2->sign == '\0') {
          if (0 < (int)uVar6) {
            uVar3 = 1;
            do {
              pdVar1 = *(double **)((long)__ptr_00 + uVar3 * 8 + -8);
              if (uVar6 <= uVar3) break;
              uVar3 = uVar3 + 1;
            } while (pdVar1 != __ptr);
            if (pdVar1 == __ptr) goto LAB_001c2c0e;
          }
          free(__ptr);
          if (uVar6 == uVar4) {
            uVar4 = uVar4 * 2;
            __ptr_00 = realloc(__ptr_00,(long)(int)uVar4 << 3);
          }
          *(double **)((long)__ptr_00 + (long)(int)uVar6 * 8) = __ptr;
          uVar6 = uVar6 + 1;
        }
        else {
          free(__ptr);
        }
      }
LAB_001c2c0e:
      lVar5 = lVar5 + 1;
    } while (lVar5 < Rgn->nShapes);
  }
  if (Rgn->Shapes != (RgnShape *)0x0) {
    free(Rgn->Shapes);
  }
  free(Rgn);
  free(__ptr_00);
  return;
}

Assistant:

void fits_free_region( SAORegion *Rgn )
/*   Free up memory allocated to hold the region data.                       
   This is more complicated for the case of polygons, which may be sharing
   points arrays due to shallow copying (in fits_set_region_components) of
   'exluded' regions.  We must ensure that these arrays are only freed once.       

/*---------------------------------------------------------------------------*/
{
   int i,j;
   
   int nFreedPoly=0;
   int nPolyArraySize=10;
   double **freedPolyPtrs=0;
   double *ptsToFree=0;
   int isAlreadyFreed=0;
   
   freedPolyPtrs = (double**)malloc(nPolyArraySize*sizeof(double*));

   for( i=0; i<Rgn->nShapes; i++ )
      if( Rgn->Shapes[i].shape == poly_rgn )
      {
         /* No shared arrays for 'include' polygons */
         if (Rgn->Shapes[i].sign)
            free(Rgn->Shapes[i].param.poly.Pts);
         else
         {
            ptsToFree = Rgn->Shapes[i].param.poly.Pts;
            isAlreadyFreed = 0;
            for (j=0; j<nFreedPoly && !isAlreadyFreed; j++)
            {
               if (freedPolyPtrs[j] == ptsToFree)
                  isAlreadyFreed = 1;
            }
            if (!isAlreadyFreed)
            {
               free(ptsToFree);
               /* Now add pointer to array of freed points */
               if (nFreedPoly == nPolyArraySize)
               {
                  nPolyArraySize *= 2;
                  freedPolyPtrs = (double **)realloc(freedPolyPtrs, 
                          nPolyArraySize*sizeof(double*));
               }
               freedPolyPtrs[nFreedPoly] = ptsToFree;
               ++nFreedPoly;
            }
         }
      }
   if( Rgn->Shapes )
      free( Rgn->Shapes );
   free( Rgn );
   
   free(freedPolyPtrs);
}